

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O3

void __thiscall Hpipe::Source::Source(Source *this,char *file)

{
  size_t __size;
  size_t sVar1;
  char *__dest;
  long lVar2;
  char *pcVar3;
  ifstream f;
  long local_238 [4];
  byte abStack_218 [488];
  
  this->prev = (Source *)0x0;
  sVar1 = strlen(file);
  __size = sVar1 + 1;
  std::ifstream::ifstream(local_238,file,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    std::istream::seekg((long)local_238,_S_beg);
    lVar2 = std::istream::tellg();
    std::istream::seekg((long)local_238,_S_beg);
    pcVar3 = (char *)malloc(__size + lVar2 + 1);
    this->rese = pcVar3;
    std::istream::read((char *)local_238,(long)(pcVar3 + __size));
    this->rese[lVar2 + 1 + sVar1] = '\0';
    __dest = this->rese;
    pcVar3 = __dest + __size;
  }
  else {
    __dest = (char *)malloc(__size);
    this->rese = __dest;
    pcVar3 = (char *)0x0;
  }
  this->data = pcVar3;
  memcpy(__dest,file,__size);
  this->provenance = this->rese;
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

Source::Source( const char *file ) : prev( 0 ) {
    ssize_t size_prov = strlen( file ) + 1;

    std::ifstream f( file );
    if ( f ) {
        f.seekg( 0, ios_base::end );
        ssize_t size_data = f.tellg() + ssize_t( 1 );
        f.seekg( 0, ios_base::beg );

        rese = (char *)malloc( size_prov + size_data );

        f.read( rese + size_prov, size_data - 1 );
        rese[ size_prov + size_data - 1 ] = 0;
        data = rese + size_prov;
    } else {
        rese = (char *)malloc( size_prov );
        data = 0;
    }

    // copy file -> provenance
    memcpy( rese, file, size_prov );
    provenance = rese;
}